

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O2

void __thiscall
Centaurus::ATNNode<unsigned_char>::parse(ATNNode<unsigned_char> *this,Stream *stream)

{
  wchar_t *pwVar1;
  ATNNodeType AVar2;
  bool bVar3;
  wchar_t wVar4;
  StreamException *__return_storage_ptr__;
  int iVar5;
  
  pwVar1 = (stream->m_cur)._M_current;
  if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
    wVar4 = L'\0';
  }
  else {
    wVar4 = *pwVar1;
  }
  bVar3 = Identifier::is_symbol_leader(wVar4);
  if (bVar3) {
    Identifier::parse(&this->m_invoke,stream);
    AVar2 = Nonterminal;
  }
  else if ((wVar4 == L'\"') || (wVar4 == L'\'')) {
    parse_literal(this,stream);
    AVar2 = LiteralTerminal;
  }
  else {
    if (wVar4 != L'/') {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,wVar4);
      goto LAB_0014a833;
    }
    Stream::get(stream);
    NFA<unsigned_char>::parse(&this->m_nfa,stream);
    AVar2 = RegularTerminal;
  }
  this->m_type = AVar2;
  wVar4 = Stream::skip_whitespace(stream);
  if (wVar4 != L'{') {
    return;
  }
  Stream::get(stream);
  wVar4 = Stream::skip_whitespace(stream);
  if (wVar4 == L'}') {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,L'}');
  }
  else {
    iVar5 = 0;
    while ((uint)(wVar4 + L'\xffffffd0') < 10) {
      iVar5 = iVar5 * 10 + wVar4 + L'\xffffffd0';
      Stream::get(stream);
      pwVar1 = (stream->m_cur)._M_current;
      wVar4 = L'\0';
      if (pwVar1 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
        wVar4 = *pwVar1;
      }
    }
    wVar4 = Stream::skip_whitespace(stream);
    if (wVar4 == L'}') {
      Stream::get(stream);
      Stream::skip_whitespace(stream);
      this->m_localid = iVar5;
      return;
    }
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,wVar4);
  }
LAB_0014a833:
  __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void ATNNode<TCHAR>::parse(Stream& stream)
{
    wchar_t ch = stream.peek();

    if (Identifier::is_symbol_leader(ch))
    {
        m_invoke.parse(stream);
        m_type = ATNNodeType::Nonterminal;
    }
    else if (ch == L'/')
    {
        stream.discard();
        m_nfa.parse(stream);
        m_type = ATNNodeType::RegularTerminal;
    }
    else if (ch == L'\'' || ch == L'"')
    {
        parse_literal(stream);
        m_type = ATNNodeType::LiteralTerminal;
    }
    else
    {
        throw stream.unexpected(ch);
    }

    ch = stream.skip_whitespace();

    if (ch == L'{')
    {
		stream.discard();

        ch = stream.skip_whitespace();

        if (ch == L'}')
            throw stream.unexpected(ch);

        int id = 0;
        for (; L'0' <= ch && ch <= L'9'; ch = stream.peek())
        {
            id = id * 10 + static_cast<int>(ch - L'0');
            stream.discard();
        }
        
        ch = stream.skip_whitespace();
        if (ch != L'}')
            throw stream.unexpected(ch);
        stream.discard();

		stream.skip_whitespace();

        m_localid = id;
    }
}